

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O0

void __thiscall argo::unparser::unparse_object(unparser *this,json *j,int indent_level)

{
  char *pcVar1;
  bool bVar2;
  type tVar3;
  writer *pwVar4;
  json_object *pjVar5;
  size_type sVar6;
  pointer pjVar7;
  type pjVar8;
  int iVar9;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  reference local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>
  *p;
  const_iterator __end1;
  const_iterator __begin1;
  json_object *__range1;
  int n;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  json *pjStack_18;
  int indent_level_local;
  json *j_local;
  unparser *this_local;
  
  local_1c = indent_level;
  pjStack_18 = j;
  j_local = (json *)this;
  print_indent(this,indent_level);
  pwVar4 = argo::operator<<(this->m_writer,'{');
  pcVar1 = this->m_space;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,&local_41);
  pwVar4 = argo::operator<<(pwVar4,(string *)local_40);
  pcVar1 = this->m_newline;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&n,pcVar1,(allocator *)((long)&__range1 + 7));
  argo::operator<<(pwVar4,(string *)&n);
  std::__cxx11::string::~string((string *)&n);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pjVar5 = json::get_object_abi_cxx11_(pjStack_18);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
          ::size(pjVar5);
  __range1._0_4_ = (int)sVar6;
  pjVar5 = json::get_object_abi_cxx11_(pjStack_18);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
           ::begin(pjVar5);
  p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
         ::end(pjVar5);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&p);
    if (!bVar2) {
      print_indent(this,local_1c);
      pwVar4 = this->m_writer;
      pcVar1 = this->m_space;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,pcVar1,&local_161);
      pwVar4 = argo::operator<<(pwVar4,(string *)local_160);
      argo::operator<<(pwVar4,'}');
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      return;
    }
    local_a0 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
               ::operator*(&__end1);
    print_indent(this,local_1c + this->m_indent_inc);
    pwVar4 = argo::operator<<(this->m_writer,'\"');
    pwVar4 = argo::operator<<(pwVar4,&local_a0->first);
    pwVar4 = argo::operator<<(pwVar4,'\"');
    pcVar1 = this->m_space;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
    pwVar4 = argo::operator<<(pwVar4,(string *)local_c0);
    pwVar4 = argo::operator<<(pwVar4,':');
    pcVar1 = this->m_space;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
    argo::operator<<(pwVar4,(string *)local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    pjVar7 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->
                       (&local_a0->second);
    tVar3 = json::get_instance_type(pjVar7);
    if (tVar3 == object_e) {
LAB_0013297c:
      pwVar4 = this->m_writer;
      pcVar1 = this->m_newline;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,pcVar1,&local_111);
      argo::operator<<(pwVar4,(string *)local_110);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      pjVar8 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                         (&local_a0->second);
      unparse(this,pjVar8,local_1c + this->m_indent_inc * 2);
    }
    else {
      pjVar7 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->
                         (&local_a0->second);
      tVar3 = json::get_instance_type(pjVar7);
      if (tVar3 == array_e) goto LAB_0013297c;
      pjVar8 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                         (&local_a0->second);
      unparse(this,pjVar8,local_1c + this->m_indent_inc);
    }
    iVar9 = (int)__range1 + -1;
    bVar2 = 1 < (int)__range1;
    __range1._0_4_ = iVar9;
    if (bVar2) {
      argo::operator<<(this->m_writer,',');
    }
    pwVar4 = this->m_writer;
    pcVar1 = this->m_newline;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,pcVar1,&local_139);
    argo::operator<<(pwVar4,(string *)local_138);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void unparser::unparse_object(const json &j, int indent_level)
{
    print_indent(indent_level);
    m_writer << '{' << m_space << m_newline;
    int n = j.get_object().size();
    for (const auto &p : j.get_object())
    {
        print_indent(indent_level + m_indent_inc);
        m_writer << '"' << p.first << '"' << m_space << ':' << m_space;
        if (p.second->get_instance_type() == json::object_e ||
            p.second->get_instance_type() == json::array_e)
        {
            m_writer << m_newline;
            unparse(*(p.second), indent_level + (m_indent_inc * 2));
        }
        else
        {
            unparse(*(p.second), indent_level + m_indent_inc);
        }
        if (n-- > 1)
        {
            m_writer << ',';
        }
        m_writer << m_newline;
    }
    print_indent(indent_level);
    m_writer << m_space << '}';
}